

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parse_address(char *cstr_addr,sockaddr_in *addr)

{
  char *__dest;
  ulong __n;
  long lVar1;
  sockaddr_in sVar2;
  char acStack_849 [9];
  char strport [1000];
  char local_458 [8];
  char strip [1000];
  size_t len;
  size_t pos;
  allocator local_41;
  string local_40 [8];
  string str_addr;
  sockaddr_in *addr_local;
  char *cstr_addr_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,cstr_addr,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  __n = std::__cxx11::string::find((char)local_40,0x3a);
  lVar1 = std::__cxx11::string::size();
  if (__n != 0xffffffffffffffff) {
    fprintf(_stderr,"%ld %ld %ld\n",__n,__n + 1,~__n + lVar1);
    strncpy(local_458,cstr_addr,__n);
    local_458[__n] = '\0';
    __dest = acStack_849 + 1;
    strncpy(__dest,cstr_addr + __n + 1,~__n + lVar1);
    __dest[(lVar1 - __n) + -1] = '\0';
    sVar2 = get_address(local_458,__dest);
    *addr = sVar2;
  }
  else {
    fprintf(_stderr,"Bad string\n");
  }
  strip[0x3e4] = '\x01';
  strip[0x3e5] = '\0';
  strip[0x3e6] = '\0';
  strip[999] = '\0';
  std::__cxx11::string::~string(local_40);
  return __n != 0xffffffffffffffff;
}

Assistant:

bool parse_address(char* cstr_addr, struct sockaddr_in &addr) {
    std::string str_addr(cstr_addr);
    size_t pos = str_addr.find(':');
    size_t len = str_addr.size();
    if (pos == std::string::npos) {
        fprintf(stderr, "Bad string\n");
        return false;
    }

    char strip[1000];
    char strport[1000];
    fprintf(stderr, "%ld %ld %ld\n", pos, pos + 1, len - pos - 1);
    strncpy(strip, cstr_addr, pos);
    strip[pos] = '\0';
    strncpy(strport, cstr_addr + pos + 1, len - pos - 1);
    strport[len - pos - 1] = '\0';

    addr = get_address(strip, strport);
    return true;
}